

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# localintermediate.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> * __thiscall
glslang::TIntermediate::
addCounterBufferName<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>
          (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
           *__return_storage_ptr__,TIntermediate *this,
          basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *name)

{
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *name_local;
  TIntermediate *this_local;
  
  std::operator+(__return_storage_ptr__,name,this->implicitCounterName);
  return __return_storage_ptr__;
}

Assistant:

bool hasCounterBufferName(const TString& name) const {
        size_t len = strlen(implicitCounterName);
        return name.size() > len &&
               name.compare(name.size() - len, len, implicitCounterName) == 0;
    }